

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool arm_generate_debug_exceptions(CPUARMState_conflict *env)

{
  CPUARMState_conflict *env_local;
  
  if (env->aarch64 == 0) {
    env_local._7_1_ = aa32_generate_debug_exceptions(env);
  }
  else {
    env_local._7_1_ = aa64_generate_debug_exceptions(env);
  }
  return env_local._7_1_;
}

Assistant:

static inline bool arm_generate_debug_exceptions(CPUARMState *env)
{
    if (env->aarch64) {
        return aa64_generate_debug_exceptions(env);
    } else {
        return aa32_generate_debug_exceptions(env);
    }
}